

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeData.cpp
# Opt level: O3

void NativeCodeData::AddFixupEntry
               (void *targetAddr,void *targetStartAddr,void *addrToFixup,void *startAddress,
               DataChunk *chunkList)

{
  code *pcVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  undefined4 *puVar5;
  DataChunk *pDVar6;
  DataChunk *pDVar7;
  HANDLE hHeap;
  NativeDataFixupEntry *pNVar8;
  void *pvVar9;
  
  if (addrToFixup < startAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                       ,0x2a,"(addrToFixup >= startAddress)","addrToFixup >= startAddress");
    if (!bVar4) goto LAB_005f3a97;
    *puVar5 = 0;
  }
  if (((ulong)addrToFixup & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                       ,0x2b,"(((long)addrToFixup) % sizeof(void*) == 0)",
                       "((__int64)addrToFixup) % sizeof(void*) == 0");
    if (!bVar4) goto LAB_005f3a97;
    *puVar5 = 0;
  }
  if (targetAddr == (void *)0x0) {
    return;
  }
  if (targetStartAddr == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                       ,0x32,"(targetStartAddr)","targetStartAddr");
    if (!bVar4) goto LAB_005f3a97;
    *puVar5 = 0;
    targetStartAddr = (void *)0x0;
    pvVar9 = targetAddr;
  }
  else {
    pvVar9 = (void *)((long)targetAddr - (long)targetStartAddr);
  }
  pDVar6 = GetDataChunk(targetStartAddr);
  if (pDVar6->len < (uint)pvVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                       ,0x36,"(targetChunk->len >= inDataOffset)","targetChunk->len >= inDataOffset"
                      );
    if (!bVar4) goto LAB_005f3a97;
    *puVar5 = 0;
  }
  if (DAT_015932ca == '\x01') {
    if (chunkList != (DataChunk *)0x0) {
      bVar3 = 0;
      do {
        bVar2 = bVar3;
        bVar4 = chunkList == pDVar6;
        chunkList = chunkList->next;
        bVar3 = bVar2 | bVar4;
      } while (chunkList != (DataChunk *)0x0);
      if ((bool)(bVar2 | bVar4)) goto LAB_005f399d;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                       ,0x41,"(foundTargetChunk)",
                       "current pointer is not allocated with NativeCodeData allocator?");
    if (!bVar4) goto LAB_005f3a97;
    *puVar5 = 0;
  }
LAB_005f399d:
  pDVar7 = GetDataChunk(startAddress);
  hHeap = GetProcessHeap();
  pNVar8 = (NativeDataFixupEntry *)HeapAlloc(hHeap,0,0x10);
  if (pNVar8 == (NativeDataFixupEntry *)0x0) {
    Js::Throw::OutOfMemory();
  }
  pNVar8->addrOffset = (uint)((long)addrToFixup - (long)startAddress);
  if ((ulong)pDVar7->len - 8 < ((long)addrToFixup - (long)startAddress & 0xffffffffU)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                       ,0x4e,"(entry->addrOffset <= chunk->len - sizeof(void*))",
                       "entry->addrOffset <= chunk->len - sizeof(void*)");
    if (!bVar4) {
LAB_005f3a97:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pNVar8->targetTotalOffset = (uint)pvVar9 + pDVar6->offset;
  pNVar8->next = pDVar7->fixupList;
  pDVar7->fixupList = pNVar8;
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,NativeCodeDataPhase);
  if (bVar4) {
    Output::Print(L"NativeCodeData Add Fixup: %p(%p+%d, chunk:%p)  -->  %p(chunk:%p)  %S\n",
                  addrToFixup,startAddress,(ulong)pNVar8->addrOffset,pDVar7,targetAddr,pDVar6,
                  pDVar7->dataType);
  }
  return;
}

Assistant:

void
NativeCodeData::AddFixupEntry(void* targetAddr, void* targetStartAddr, void* addrToFixup, void* startAddress, DataChunk * chunkList)
{
    Assert(addrToFixup >= startAddress);
    Assert(((__int64)addrToFixup) % sizeof(void*) == 0);

    if (targetAddr == nullptr)
    {
        return;
    }

    Assert(targetStartAddr);

    unsigned int inDataOffset = (unsigned int)((char*)targetAddr - (char*)targetStartAddr);
    DataChunk* targetChunk = NativeCodeData::GetDataChunk(targetStartAddr);
    Assert(targetChunk->len >= inDataOffset);

#if DBG
    if (CONFIG_FLAG(OOPJITFixupValidate))
    {
        bool foundTargetChunk = false;
        while (chunkList)
        {
            foundTargetChunk |= (chunkList == targetChunk);
            chunkList = chunkList->next;
        }
        AssertMsg(foundTargetChunk, "current pointer is not allocated with NativeCodeData allocator?"); // change to valid check instead of assertion?
    }
#endif

    DataChunk* chunk = NativeCodeData::GetDataChunk(startAddress);

    NativeDataFixupEntry* entry = (NativeDataFixupEntry*)midl_user_allocate(sizeof(NativeDataFixupEntry));
    if (!entry)
    {
        Js::Throw::OutOfMemory();
    }
    __analysis_assume(entry);
    entry->addrOffset = (unsigned int)((__int64)addrToFixup - (__int64)startAddress);
    Assert(entry->addrOffset <= chunk->len - sizeof(void*));

    entry->targetTotalOffset = targetChunk->offset + inDataOffset;
    entry->next = chunk->fixupList;
    chunk->fixupList = entry;

#if DBG
    if (PHASE_TRACE1(Js::NativeCodeDataPhase))
    {
        Output::Print(_u("NativeCodeData Add Fixup: %p(%p+%d, chunk:%p)  -->  %p(chunk:%p)  %S\n"),
            addrToFixup, startAddress, entry->addrOffset, (void*)chunk, targetAddr, (void*)targetChunk, chunk->dataType);
    }
#endif
}